

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest15DeltaCRLs_::
Section15ValiddeltaCRLTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section15ValiddeltaCRLTest8
          (Section15ValiddeltaCRLTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section15ValiddeltaCRLTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *this_local
  ;
  
  ~Section15ValiddeltaCRLTest8(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest15DeltaCRLs, Section15ValiddeltaCRLTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "deltaCRLCA2Cert",
                               "ValiddeltaCRLTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "deltaCRLCA2CRL",
                              "deltaCRLCA2deltaCRL"};
  PkitsTestInfo info;
  info.test_number = "4.15.8";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}